

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-wast-parser.cc
# Opt level: O3

Errors * anon_unknown.dwarf_121e8a::ParseInvalidModule(Errors *__return_storage_ptr__,string text)

{
  __uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_> _Var1;
  bool bVar2;
  Errors *extraout_RAX;
  Errors *extraout_RAX_00;
  Errors *extraout_RAX_01;
  Errors *pEVar3;
  size_t in_RSI;
  char *message;
  string_view filename;
  Message local_58;
  WastLexer *local_50;
  __uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_> local_48;
  Result local_3c;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  WastParseOptions local_1d;
  
  filename.size_ = (size_type)"test";
  filename.data_ = (char *)&local_50;
  wabt::WastLexer::CreateBufferLexer(filename,(void *)0x4,in_RSI);
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
       (tuple<wabt::Module_*,_std::default_delete<wabt::Module>_>)
       (_Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>)0x0;
  local_1d.features.exceptions_enabled_ = false;
  local_1d.features.mutable_globals_enabled_ = true;
  local_1d.features.sat_float_to_int_enabled_ = false;
  local_1d.features.sign_extension_enabled_ = false;
  local_1d.features.simd_enabled_ = false;
  local_1d.features.threads_enabled_ = false;
  local_1d.features.multi_value_enabled_ = false;
  local_1d.features.tail_call_enabled_ = false;
  local_1d.features.bulk_memory_enabled_ = false;
  local_1d.features.reference_types_enabled_ = false;
  local_1d.features.annotations_enabled_ = false;
  local_1d.features.gc_enabled_ = false;
  local_1d.debug_parsing = false;
  local_3c = wabt::ParseWatModule
                       (local_50,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                                 &local_48,__return_storage_ptr__,&local_1d);
  local_58.ss_.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            (local_38,"Result::Error","result",(Enum *)&local_58,&local_3c);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message(&local_58);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-wast-parser.cc"
               ,0x2b,message);
    testing::internal::AssertHelper::operator=(&local_28,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58.ss_.ptr_._4_4_,local_58.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  _Var1._M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
  super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
       local_48._M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
       super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl;
  pEVar3 = extraout_RAX;
  if ((_Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>)
      local_48._M_t.super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
      super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl != (Module *)0x0) {
    wabt::Module::~Module
              ((Module *)
               local_48._M_t.
               super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
               super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl);
    operator_delete((void *)_Var1._M_t.
                            super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>
                            .super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl);
    pEVar3 = extraout_RAX_00;
  }
  if (local_50 != (WastLexer *)0x0) {
    std::default_delete<wabt::WastLexer>::operator()
              ((default_delete<wabt::WastLexer> *)&local_50,local_50);
    pEVar3 = extraout_RAX_01;
  }
  return pEVar3;
}

Assistant:

Errors ParseInvalidModule(std::string text) {
  auto lexer = WastLexer::CreateBufferLexer("test", text.c_str(), text.size());
  Errors errors;
  std::unique_ptr<Module> module;
  Features features;
  WastParseOptions options(features);
  Result result = ParseWatModule(lexer.get(), &module, &errors, &options);
  EXPECT_EQ(Result::Error, result);

  return errors;
}